

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SoundEmu.c
# Opt level: O0

UINT8 SndEmu_Start(UINT8 deviceID,DEV_GEN_CFG *cfg,DEV_INFO *retDevInf)

{
  UINT8 UVar1;
  DEV_DEF **ppDStack_30;
  UINT8 retVal;
  DEV_DEF **curDIL;
  DEV_DEF **diList;
  DEV_INFO *retDevInf_local;
  DEV_GEN_CFG *cfg_local;
  UINT8 deviceID_local;
  
  ppDStack_30 = SndEmu_GetDevDefList(deviceID);
  if (ppDStack_30 == (DEV_DEF **)0x0) {
    cfg_local._7_1_ = 0xf0;
  }
  else {
    for (; *ppDStack_30 != (DEV_DEF *)0x0; ppDStack_30 = ppDStack_30 + 1) {
      if ((cfg->emuCore == 0) || ((*ppDStack_30)->coreID == cfg->emuCore)) {
        UVar1 = (*(*ppDStack_30)->Start)(cfg,retDevInf);
        if (UVar1 != '\0') {
          return UVar1;
        }
        (*(*ppDStack_30)->Reset)(retDevInf->dataPtr);
        return '\0';
      }
    }
    cfg_local._7_1_ = 0xf8;
  }
  return cfg_local._7_1_;
}

Assistant:

UINT8 SndEmu_Start(UINT8 deviceID, const DEV_GEN_CFG* cfg, DEV_INFO* retDevInf)
{
	const DEV_DEF** diList;
	const DEV_DEF** curDIL;
	
	diList = SndEmu_GetDevDefList(deviceID);
	if (diList == NULL)
		return EERR_UNK_DEVICE;
	
	for (curDIL = diList; *curDIL != NULL; curDIL ++)
	{
		// emuCore == 0 -> use default
		if (! cfg->emuCore || (*curDIL)->coreID == cfg->emuCore)
		{
			UINT8 retVal;
			
			retVal = (*curDIL)->Start(cfg, retDevInf);
			if (! retVal)	// if initialization is successful, reset the chip to ensure a clean state
				(*curDIL)->Reset(retDevInf->dataPtr);
			return retVal;
		}
	}
	return EERR_NOT_FOUND;
}